

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O0

int __thiscall ServerManager::think(ServerManager *this)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  pointer pIVar3;
  size_type sVar4;
  const_iterator local_30;
  unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *local_28;
  __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
  local_20;
  __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
  local_18;
  iterator itr;
  ServerManager *this_local;
  
  itr._M_current = (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)this;
  local_18._M_current =
       (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)
       std::
       vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
       ::begin(&this->m_servers);
  while( true ) {
    local_20._M_current =
         (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)
         std::
         vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
         ::end(&this->m_servers);
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
                      (&local_18,&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
              ::operator*(&local_18);
    pIVar3 = std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>::operator->(this_00);
    iVar2 = (*(code *)**(undefined8 **)pIVar3)();
    if (iVar2 == 0) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
      ::operator++(&local_18);
    }
    else {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>const*,std::vector<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>,std::allocator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>>>
      ::__normal_iterator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>*>
                ((__normal_iterator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>const*,std::vector<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>,std::allocator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>>>
                  *)&local_30,&local_18);
      local_28 = (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)
                 std::
                 vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
                 ::erase(&this->m_servers,local_30);
      local_18._M_current = local_28;
    }
  }
  sVar4 = std::
          vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
          ::size(&this->m_servers);
  return (int)(sVar4 != 0);
}

Assistant:

int ServerManager::think() {
	for (auto itr = m_servers.begin(); itr != m_servers.end();) {
		if ((*itr)->think() != 0) {
			itr = m_servers.erase(itr);
			continue;
		}
		++itr;
	}

	return m_servers.size() != 0;
}